

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

PostfixExpr * __thiscall
(anonymous_namespace)::Db::
make<(anonymous_namespace)::PostfixExpr,(anonymous_namespace)::Node*&,char_const(&)[3]>
          (Db *this,Node **args,char (*args_1) [3])

{
  Node *Child_;
  PostfixExpr *this_00;
  StringView local_30;
  char (*local_20) [3];
  char (*args_local_1) [3];
  Node **args_local;
  Db *this_local;
  
  local_20 = args_1;
  args_local_1 = (char (*) [3])args;
  args_local = (Node **)this;
  this_00 = (PostfixExpr *)
            anon_unknown.dwarf_32f1a0::BumpPointerAllocator::allocate
                      ((BumpPointerAllocator *)(this + 0x2f0),0x28);
  Child_ = *(Node **)args_local_1;
  StringView::StringView(&local_30,*local_20);
  anon_unknown.dwarf_32f1a0::PostfixExpr::PostfixExpr(this_00,Child_,local_30);
  return this_00;
}

Assistant:

T *make(Args &&... args) {
    return new (ASTAllocator.allocate(sizeof(T)))
        T(std::forward<Args>(args)...);
  }